

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

Gia_Man_t * Gia_ManUpdateExtraAig(void *pTime,Gia_Man_t *p,Vec_Int_t *vBoxPres)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Gia_Man_t *pGVar6;
  long lVar7;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  iVar3 = vBoxPres->nSize;
  iVar1 = Tim_ManBoxNum((Tim_Man_t *)pTime);
  if (iVar3 != iVar1) {
    __assert_fail("Vec_IntSize(vBoxPres) == Tim_ManBoxNum(pManTime)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x2b9,"Gia_Man_t *Gia_ManUpdateExtraAig(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar3 = p->vCos->nSize;
  iVar1 = Tim_ManCiNum((Tim_Man_t *)pTime);
  iVar2 = Tim_ManPiNum((Tim_Man_t *)pTime);
  if (iVar3 != iVar1 - iVar2) {
    __assert_fail("Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - Tim_ManPiNum(pManTime)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x2ba,"Gia_Man_t *Gia_ManUpdateExtraAig(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar3 = Tim_ManBoxNum((Tim_Man_t *)pTime);
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  else {
    lVar7 = 0;
    iVar3 = 0;
    do {
      iVar2 = (int)lVar7;
      iVar1 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,iVar2);
      if (0 < iVar1) {
        iVar1 = 0;
        do {
          if (vBoxPres->nSize <= lVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          Vec_IntPush(p_00,vBoxPres->pArray[lVar7]);
          iVar1 = iVar1 + 1;
          iVar4 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,iVar2);
        } while (iVar1 < iVar4);
      }
      iVar1 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,iVar2);
      iVar3 = iVar3 + iVar1;
      lVar7 = lVar7 + 1;
      iVar1 = Tim_ManBoxNum((Tim_Man_t *)pTime);
    } while (lVar7 < iVar1);
  }
  if (iVar3 != p->vCos->nSize) {
    __assert_fail("curPo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x2c1,"Gia_Man_t *Gia_ManUpdateExtraAig(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  pGVar6 = Gia_ManDupOutputVec(p,p_00);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManUpdateExtraAig( void * pTime, Gia_Man_t * p, Vec_Int_t * vBoxPres )
{
    Gia_Man_t * pNew;
    Tim_Man_t * pManTime = (Tim_Man_t *)pTime;
    Vec_Int_t * vOutPres = Vec_IntAlloc( 100 );
    int i, k, curPo = 0;
    assert( Vec_IntSize(vBoxPres) == Tim_ManBoxNum(pManTime) );
    assert( Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - Tim_ManPiNum(pManTime) );
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            Vec_IntPush( vOutPres, Vec_IntEntry(vBoxPres, i) );
        curPo += Tim_ManBoxOutputNum(pManTime, i);
    }
    assert( curPo == Gia_ManCoNum(p) );
    pNew = Gia_ManDupOutputVec( p, vOutPres );
    Vec_IntFree( vOutPres );
    return pNew;
}